

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O0

int dfft_create_execution_flow(dfft_plan *plan)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int *in_RDI;
  int howmany_3;
  int *dim_3;
  int odist_1;
  int ostride_1;
  int idist_1;
  int istride_1;
  int howmany_2;
  int dim_2;
  int s;
  int size;
  int howmany_1;
  int *dim_1;
  int dim;
  int howmany;
  int odist;
  int idist;
  int ostride;
  int istride;
  int n;
  int decompose_1d;
  int l;
  int p;
  int j;
  int d;
  int i;
  int local_14;
  int local_10;
  int local_c;
  
  pvVar3 = malloc((long)*in_RDI << 2);
  *(void **)(in_RDI + 0x3a) = pvVar3;
  in_RDI[0x39] = 0;
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    local_10 = 0;
    iVar1 = *(int *)(*(long *)(in_RDI + 0x16) + (long)local_c * 4);
    iVar2 = *(int *)(*(long *)(in_RDI + 2) + (long)local_c * 4) / iVar1;
    if (1 < iVar2) {
      for (local_14 = *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_c * 4); local_14 <= iVar1;
          local_14 = iVar2 * local_14) {
        local_10 = local_10 + 1;
      }
    }
    *(int *)(*(long *)(in_RDI + 0x3a) + (long)local_c * 4) = local_10;
    if (in_RDI[0x39] < local_10) {
      in_RDI[0x39] = local_10;
    }
  }
  if (in_RDI[0x39] != 0) {
    pvVar3 = malloc((long)in_RDI[0x39] << 2);
    *(void **)(in_RDI + 0x3c) = pvVar3;
  }
  local_10 = in_RDI[0x39];
  while (local_10 = local_10 + -1, -1 < local_10) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    }
    *(int *)(*(long *)(in_RDI + 0x3c) + (long)local_10 * 4) = *in_RDI;
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    }
  }
  in_RDI[0x3e] = 1;
  in_RDI[0x3e] = 0;
  if (in_RDI[0x3e] == 0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    }
  }
  else {
    pvVar3 = malloc((long)*in_RDI << 2);
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      *(int *)((long)pvVar3 + (long)local_c * 4) =
           *(int *)(*(long *)(in_RDI + 2) + (long)local_c * 4) /
           *(int *)(*(long *)(in_RDI + 0x16) + (long)local_c * 4);
    }
    free(pvVar3);
  }
  return 0;
}

Assistant:

int dfft_create_execution_flow(dfft_plan *plan)
    {
    /* compute depth of parallel fft (number of redistributions/dimension) */
    plan->depth = malloc(sizeof(int)*plan->ndim);
    plan->max_depth = 0;
    int i,d,j;
    for (i=0; i< plan->ndim; ++i)
        {
        d = 0;
        int p = plan->pdim[i];
        int l = plan->gdim[i]/p;
        if (l > 1)
            {
            for (j = plan->k0[i]; j <= p; j*=l)
                d++;
            }
        plan->depth[i] = d;
        if (d > plan->max_depth) plan->max_depth = d;
        }

    if (plan->max_depth)
        plan->n_fft = (int *)malloc(sizeof(int)*plan->max_depth);

    /* we always decompose into 1d FFTs when the backend doesn't support
     * multidimensional */
    int decompose_1d = 1 ;
    #ifdef ENABLE_CUDA
    if (plan->device)
        {
        #ifdef CUDA_FFT_SUPPORTS_MULTI
        decompose_1d = ((plan->ndim > CUDA_FFT_MAX_N) ? 1 : 0);
        #else
        decompose_1d = 1;
        #endif

        }
    else
    #endif
        {
        #ifdef HOST_FFT_SUPPORTS_MULTI
        decompose_1d = 0;
        #else
        decompose_1d = 1;
        #endif
        }

    /* allocate plans */
    #ifdef ENABLE_CUDA
    if (plan->device)
        {
        if (plan->max_depth)
            {
            plan->cuda_plans_multi_fw =
                (cuda_plan_t **)malloc(sizeof(cuda_plan_t *)*plan->max_depth);
            plan->cuda_plans_multi_bw =
                (cuda_plan_t **)malloc(sizeof(cuda_plan_t *)*plan->max_depth);
           }
        }
    #endif

    /* now create plans for every level, except the lowest */
    /* this is a general 'vector-radix' implementation */
    for (d = plan->max_depth-1; d >= 0; d--)
        {
        /* count number of ffts at this level in all dimensions */
        int n = 0;
        for (i = 0; i < plan->ndim; ++i)
            if (plan->depth[i] > d) n++;

        if (n < plan->ndim || decompose_1d)
            {
            /* 1D FFT for all 'active' dimensions, transposing as we go */
            plan->n_fft[d] = plan->ndim;

            /* allocate ndim plans */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                plan->cuda_plans_multi_fw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
                plan->cuda_plans_multi_bw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
                }
            #endif

            for (i = 0; i< plan->ndim; ++i)
                {
                int istride = plan->size_in/plan->inembed[i];
                int ostride = 1;
                int idist = 1;
                int odist = plan->inembed[i];
                int howmany = plan->size_in/plan->inembed[i];

                /* if at this level, there is no planned FFT along the current
                 * dimension, just proceed  */
                int dim;
                if (plan->depth[i] > d)
                    {
                    dim = plan->gdim[i]/plan->pdim[i];

                    #ifdef ENABLE_CUDA
                    if (plan->device)
                        {
                        int res;
                        res = dfft_cuda_create_1d_plan(&plan->cuda_plans_multi_fw[d][i],
                            dim, howmany, istride, idist, ostride, odist, 0);
                        CHECK_PLAN_CREATE(res);
                        res = dfft_cuda_create_1d_plan(&plan->cuda_plans_multi_bw[d][i],
                            dim, howmany, istride, idist, ostride, odist, 1);
                        CHECK_PLAN_CREATE(res);
                        }
                    #endif
                    }
                }
            }
        else
            {
            /* all dimensions have equal length, use multidimensinoal FFT */
            plan->n_fft[d] = 1;

            /* allocate plan */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                plan->cuda_plans_multi_fw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
                plan->cuda_plans_multi_bw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
                }
            #endif

            int *dim = malloc(sizeof(int)*plan->ndim);
            for (i = 0; i < plan->ndim; ++i)
                dim[i] = plan->gdim[i]/plan->pdim[i];

            int howmany = 1;
            /* create multidimensional forward and backward plans */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                int res;
                res = dfft_cuda_create_nd_plan(&plan->cuda_plans_multi_fw[d][0],
                    plan->ndim, dim, howmany,
                    plan->inembed, 1, 1, plan->inembed, 1, 1, 0);
                CHECK_PLAN_CREATE(res);
                res = dfft_cuda_create_nd_plan(&plan->cuda_plans_multi_bw[d][0],
                    plan->ndim, dim, howmany,
                    plan->inembed, 1, 1, plan->inembed, 1, 1, 1);
                CHECK_PLAN_CREATE(res);
                }
            #endif
            free(dim);
            }
        } /* end loop over levels */

    /* create plans for final stage */
    plan->final_multi = 1;
    if (decompose_1d)
        {
        plan->final_multi = 0;
        }
    else
        {
        /* find out if we are doing a full FFT in every dimension */
        for (i = 0; i < plan->ndim; ++i)
            if (! (plan->k0[i] == plan->gdim[i]/plan->pdim[i]))
                {
                plan->final_multi = 0;
                break;
                }
        }

    if (!plan->final_multi)
        {
        /* again, we proceed by doing partial 1d FFTs dimension-wise,
         * in between we have to transpose */

        /* allocate plans */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            plan->cuda_plans_final_fw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
            plan->cuda_plans_final_bw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
            }
        #endif

        int size = plan->size_in;
        for (i = 0; i < plan->ndim; ++i)
            {
            int s = size/plan->inembed[i] *(plan->gdim[i]/plan->pdim[i]);
            int dim = plan->k0[i];
            int howmany = s/(plan->k0[i]);
            int istride = s/(plan->k0[i]);
            int idist = 1;
            int ostride = s/(plan->k0[i]);
            int odist = 1;

            #ifdef ENABLE_CUDA
            int res;
            res = dfft_cuda_create_1d_plan(&plan->cuda_plans_final_fw[i],
                dim, howmany, istride, idist, ostride, odist, 0);
            CHECK_PLAN_CREATE(res);
            res = dfft_cuda_create_1d_plan(&plan->cuda_plans_final_bw[i],
                dim, howmany, istride, idist, ostride, odist, 1);
            CHECK_PLAN_CREATE(res);
            #endif

            /* this time, we change to the output embedding */
            size /= plan->inembed[i];
            size *= plan->oembed[i];
            }
        }
    else
        {
        /* the final stage is a multidimensional transform */
        /* allocate plan */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            plan->cuda_plans_final_fw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
            plan->cuda_plans_final_bw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
            }
        #endif

        int *dim = malloc(sizeof(int)*plan->ndim);
        for (i = 0; i < plan->ndim; ++i)
            dim[i] = plan->gdim[i]/plan->pdim[i];

        int howmany = 1;
        /* create multidimensional forward and backward plans */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            int res;
            res = dfft_cuda_create_nd_plan(&plan->cuda_plans_final_fw[0],
                plan->ndim, dim, howmany,
                plan->inembed, 1, 1, plan->oembed, 1, 1, 0);
            CHECK_PLAN_CREATE(res);
            res = dfft_cuda_create_nd_plan(&plan->cuda_plans_final_bw[0],
                plan->ndim, dim, howmany,
                plan->inembed, 1, 1, plan->oembed, 1, 1, 1);
            CHECK_PLAN_CREATE(res);
            }
        #endif
        free(dim);
        }
    return 0;
    }